

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O2

void chatra::emb::io::fileInputStream_seek(Ct *ct)

{
  IFile *pIVar1;
  int iVar2;
  SeekOrigin SVar3;
  FileInputStreamData *pFVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  size_t originIndex;
  
  pFVar4 = derefSelfAsInput(ct);
  std::mutex::lock(&pFVar4->mt);
  pIVar1 = (pFVar4->file)._M_t.
           super___uniq_ptr_impl<chatra::IFile,_std::default_delete<chatra::IFile>_>._M_t.
           super__Tuple_impl<0UL,_chatra::IFile_*,_std::default_delete<chatra::IFile>_>.
           super__Head_base<0UL,_chatra::IFile_*,_false>._M_head_impl;
  originIndex = 0;
  iVar2 = (*ct->_vptr_NativeCallContext[10])(ct);
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar2));
  SVar3 = parseOrigin(ct,originIndex);
  (*pIVar1->_vptr_IFile[6])(pIVar1,uVar5,(ulong)SVar3);
  pthread_mutex_unlock((pthread_mutex_t *)&pFVar4->mt);
  return;
}

Assistant:

static void fileInputStream_seek(Ct& ct) {
	auto* self = derefSelfAsInput(ct);
	std::lock_guard<std::mutex> lock(self->mt);
	self->file->seek(ct.at(0).get<ptrdiff_t>(), parseOrigin(ct, 1));
}